

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BaseVertexGroup::init
          (BaseVertexGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  long *plVar3;
  undefined8 *puVar4;
  DrawTest *this_00;
  long *extraout_RAX;
  ulong *puVar5;
  IndexType type;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec spec;
  string local_2b0;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  IndexType local_26c;
  long *local_268;
  undefined8 local_260;
  long local_258;
  undefined8 uStack_250;
  long local_248;
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  BaseVertexGroup *local_200;
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  genBasicSpec(&local_1f8,this->m_method);
  local_1f8.indexStorage = STORAGE_BUFFER;
  local_248 = 0;
  local_200 = this;
  do {
    local_290 = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"index_","");
    lVar9 = local_248 * 0x10;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_198 = *puVar5;
      lStack_190 = plVar3[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar5;
      local_1a8 = (ulong *)*plVar3;
    }
    local_1a0 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_26c = *(IndexType *)(&DAT_01c93c64 + lVar9);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2b0,(DrawTestSpec *)(ulong)local_26c,(IndexType)local_1a0);
    uVar8 = 0xf;
    if (local_1a8 != &local_198) {
      uVar8 = local_198;
    }
    if (uVar8 < local_2b0._M_string_length + local_1a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_2b0._M_string_length + local_1a0) goto LAB_01678685;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_01678685:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_268 = &local_258;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_258 = *plVar3;
      uStack_250 = puVar4[3];
    }
    else {
      local_258 = *plVar3;
      local_268 = (long *)*puVar4;
    }
    local_260 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index ","");
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2b0,(DrawTestSpec *)(ulong)local_26c,type);
    uVar8 = 0xf;
    if (local_1a8 != &local_198) {
      uVar8 = local_198;
    }
    if (uVar8 < local_2b0._M_string_length + local_1a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_2b0._M_string_length + local_1a0) goto LAB_016787b4;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_016787b4:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_290 = &local_280;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_280 = *plVar3;
      uStack_278 = puVar4[3];
    }
    else {
      local_280 = *plVar3;
      local_290 = (long *)*puVar4;
    }
    local_288 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_268,
               (char *)local_290);
    local_1f8.indexType = local_26c;
    lVar6 = 0;
    bVar1 = true;
    do {
      bVar10 = bVar1;
      local_220 = local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"base vertex ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar2 = *(int *)(&DAT_01c93c68 + lVar6 * 4 + lVar9);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_220 != local_210) {
        uVar8 = local_210[0];
      }
      if (uVar8 < (ulong)(local_238 + local_218)) {
        uVar8 = 0xf;
        if (local_240 != local_230) {
          uVar8 = local_230[0];
        }
        if (uVar8 < (ulong)(local_238 + local_218)) goto LAB_01678947;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_220);
      }
      else {
LAB_01678947:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_240);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      puVar5 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5) {
        local_2b0.field_2._M_allocated_capacity = *puVar5;
        local_2b0.field_2._8_8_ = puVar4[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar5;
        local_2b0._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_2b0._M_string_length = puVar4[1];
      *puVar4 = puVar5;
      puVar4[1] = 0;
      *(undefined1 *)puVar5 = 0;
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      local_1f8.baseVertex = iVar2;
      deqp::gls::DrawTest::addIteration(this_00,&local_1f8,local_2b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      this = local_200;
      lVar6 = 1;
      bVar1 = false;
    } while (bVar10);
    tcu::TestNode::addChild((TestNode *)local_200,(TestNode *)this_00);
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    plVar3 = &local_258;
    if (local_268 != plVar3) {
      operator_delete(local_268,local_258 + 1);
      plVar3 = extraout_RAX;
    }
    iVar2 = (int)plVar3;
    local_248 = local_248 + 1;
    if (local_248 == 6) {
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar2 = extraout_EAX;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

void BaseVertexGroup::init (void)
{
	struct IndexTest
	{
		bool							positiveBase;
		gls::DrawTestSpec::IndexType	type;
		int								baseVertex[2];
	};

	const IndexTest tests[] =
	{
		{ true,  gls::DrawTestSpec::INDEXTYPE_BYTE,		{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_SHORT,	{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_INT,		{  1,  2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_BYTE,		{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_SHORT,	{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_INT,		{ -1, -2 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + (indexTest.positiveBase ? "" : "neg_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.baseVertex); ++iterationNdx)
		{
			const std::string iterationDesc = std::string("base vertex ") + de::toString(indexTest.baseVertex[iterationNdx]);
			spec.baseVertex	= indexTest.baseVertex[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}